

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_nil(FuncState *fs,int from,int n)

{
  int iVar1;
  uint uVar2;
  Instruction *pIVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  
  iVar1 = fs->pc;
  if (fs->lasttarget < iVar1) {
    pIVar3 = fs->f->code;
    uVar2 = pIVar3[(long)iVar1 + -1];
    if ((uVar2 & 0x3f) == 4) {
      iVar7 = n + from;
      uVar8 = uVar2 >> 6 & 0xff;
      if ((from <= (int)(uVar8 + (uVar2 >> 0x17) + 1) && (int)uVar8 <= from) ||
         (bVar4 = true, (int)uVar8 <= iVar7 && from <= (int)uVar8)) {
        iVar5 = n + from;
        iVar6 = (uVar2 >> 0x17) + uVar8;
        if ((int)uVar8 < from) {
          from = uVar8;
        }
        if (iVar6 < iVar7) {
          iVar6 = iVar5 + 0x1ff;
        }
        pIVar3[(long)iVar1 + -1] =
             (iVar6 - from) * 0x800000 | (from & 0xffU) << 6 | uVar2 & 0x7fc004;
        bVar4 = false;
      }
      if (!bVar4) {
        return;
      }
    }
  }
  luaK_code(fs,n * 0x800000 - 0x7ffffcU | from << 6);
  return;
}

Assistant:

void luaK_nil (FuncState *fs, int from, int n) {
  Instruction *previous;
  int l = from + n - 1;  /* last register to set nil */
  if (fs->pc > fs->lasttarget) {  /* no jumps to current position? */
    previous = &fs->f->code[fs->pc-1];
    if (GET_OPCODE(*previous) == OP_LOADNIL) {  /* previous is LOADNIL? */
      int pfrom = GETARG_A(*previous);  /* get previous range */
      int pl = pfrom + GETARG_B(*previous);
      if ((pfrom <= from && from <= pl + 1) ||
          (from <= pfrom && pfrom <= l + 1)) {  /* can connect both? */
        if (pfrom < from) from = pfrom;  /* from = min(from, pfrom) */
        if (pl > l) l = pl;  /* l = max(l, pl) */
        SETARG_A(*previous, from);
        SETARG_B(*previous, l - from);
        return;
      }
    }  /* else go through */
  }
  luaK_codeABC(fs, OP_LOADNIL, from, n - 1, 0);  /* else no optimization */
}